

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-multi-accept.c
# Opt level: O0

void server_cb(void *arg)

{
  int iVar1;
  undefined1 local_368 [8];
  uv_loop_t loop;
  server_ctx *ctx;
  void *arg_local;
  
  loop._840_8_ = arg;
  iVar1 = uv_loop_init((uv_loop_t *)local_368);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
            ,0x106,"0 == uv_loop_init(&loop)");
    abort();
  }
  iVar1 = uv_async_init((uv_loop_t *)local_368,(uv_async_t *)(loop._840_8_ + 0x110),sv_async_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
            ,0x108,"0 == uv_async_init(&loop, &ctx->async_handle, sv_async_cb)");
    abort();
  }
  uv_unref((uv_handle_t *)(loop._840_8_ + 0x110));
  uv_sem_wait((uv_sem_t *)(loop._840_8_ + 0x198));
  get_listen_handle((uv_loop_t *)local_368,(uv_stream_t *)loop._840_8_);
  uv_sem_post((uv_sem_t *)(loop._840_8_ + 0x198));
  iVar1 = uv_listen((uv_stream_t *)loop._840_8_,0x80,sv_connection_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
            ,0x113,"0 == uv_listen((uv_stream_t*) &ctx->server_handle, 128, sv_connection_cb)");
    abort();
  }
  iVar1 = uv_run((uv_loop_t *)local_368,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
            ,0x114,"0 == uv_run(&loop, UV_RUN_DEFAULT)");
    abort();
  }
  uv_loop_close((uv_loop_t *)local_368);
  return;
}

Assistant:

static void server_cb(void *arg) {
  struct server_ctx *ctx;
  uv_loop_t loop;

  ctx = arg;
  ASSERT(0 == uv_loop_init(&loop));

  ASSERT(0 == uv_async_init(&loop, &ctx->async_handle, sv_async_cb));
  uv_unref((uv_handle_t*) &ctx->async_handle);

  /* Wait until the main thread is ready. */
  uv_sem_wait(&ctx->semaphore);
  get_listen_handle(&loop, (uv_stream_t*) &ctx->server_handle);
  uv_sem_post(&ctx->semaphore);

  /* Now start the actual benchmark. */
  ASSERT(0 == uv_listen((uv_stream_t*) &ctx->server_handle,
                        128,
                        sv_connection_cb));
  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));

  uv_loop_close(&loop);
}